

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

VisitStatus
Fixpp::impl::
visitDictionary<Fixpp::v42::Spec::Dictionary,Fixpp::TypedParsingContext<int>,Fixpp::impl::MessageVisitor<should_be_able_to_return_value_in_visitor::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
          (TypedParsingContext<int> *context,
          MessageVisitor<should_be_able_to_return_value_in_visitor::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
          *visitor)

{
  bool bVar1;
  uint64_t uVar2;
  VisitStatus VVar3;
  
  VVar3 = VersionMismatch;
  if ((context->super_ParsingContext).version.second == 7) {
    uVar2 = getAsciiStringAsIntRecConst((context->super_ParsingContext).version.first,7,0,0);
    if (uVar2 == 0x322e342e584946) {
      bVar1 = meta::typelist::ops::Visitor<$751c0b5c$>::
              visit<Fixpp::TypedParsingContext<int>_&,_Fixpp::impl::MessageVisitor<should_be_able_to_return_value_in_visitor::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>_&>
                        (context,visitor);
      VVar3 = (uint)!bVar1 * 2;
    }
  }
  return VVar3;
}

Assistant:

VisitStatus visitDictionary(Context& context, Visitor& visitor, Rules)
        {
            using Version = typename Dictionary::Version;
            using Header = typename Dictionary::Header::Ref;
            using Messages = typename Dictionary::Messages;

            using Overrides = typename Rules::Overrides;

            auto version = context.version.first;
            auto versionSize = context.version.second;

            using MessageVisitor = DictionaryVisitor<Header, Overrides>;

            if (Version::equals(version, versionSize))
            {
                using AllMessagesVisitor = meta::typelist::ops::Visitor<Messages, MessageVisitor>;
                if (AllMessagesVisitor::visit(context, visitor))
                    return VisitStatus::Ok;

                return VisitStatus::NotFound;
            }

            return VisitStatus::VersionMismatch;
        }